

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

string * __thiscall
diligent_spirv_cross::
join<char_const(&)[2],diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>&,char_const(&)[2],diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>const&>
          (string *__return_storage_ptr__,diligent_spirv_cross *this,char (*ts) [2],
          TypedID<(diligent_spirv_cross::Types)0> *ts_1,char (*ts_2) [2],
          TypedID<(diligent_spirv_cross::Types)0> *ts_3)

{
  undefined1 local_1120 [8];
  StringStream<4096UL,_4096UL> stream;
  TypedID<(diligent_spirv_cross::Types)0> *ts_local_3;
  char (*ts_local_2) [2];
  TypedID<(diligent_spirv_cross::Types)0> *ts_local_1;
  char (*ts_local) [2];
  
  stream.saved_buffers.stack_storage.aligned_char._184_8_ = ts_2;
  StringStream<4096UL,_4096UL>::StringStream((StringStream<4096UL,_4096UL> *)local_1120);
  inner::
  join_helper<char_const(&)[2],diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>&,char_const(&)[2],diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>const&>
            ((StringStream<4096UL,_4096UL> *)local_1120,(char (*) [2])this,
             (TypedID<(diligent_spirv_cross::Types)0> *)ts,(char (*) [2])ts_1,
             (TypedID<(diligent_spirv_cross::Types)0> *)
             stream.saved_buffers.stack_storage.aligned_char._184_8_);
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,(StringStream<4096ul,4096ul> *)local_1120);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1120);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}